

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O1

void __thiscall AnalyserUnits_eq_Test::TestBody(AnalyserUnits_eq_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char cVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer __rhs_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  ScopedTrace gtest_trace_185;
  ParserPtr parser;
  ModelPtr model;
  AnalyserPtr analyser;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  operators;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  allocator_type local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  undefined1 local_2a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  pointer local_298;
  string local_290 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_280,(char (*) [3])0x145b51,(char (*) [3])"==");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_240,(char (*) [4])"neq",(char (*) [3])"!=");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[2],_true>
            (&local_200,(char (*) [3])0x13f290,(char (*) [2])"<");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_1c0,(char (*) [4])"leq",(char (*) [3])"<=");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[2],_true>
            (&local_180,(char (*) [3])"gt",(char (*) [2])0x14ac12);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_140,(char (*) [4])"geq",(char (*) [3])">=");
  __l._M_len = 6;
  __l._M_array = &local_280;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_60,__l,(allocator_type *)&local_3f8);
  lVar5 = -0x180;
  paVar7 = &local_140.second.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    if (&paVar7->_M_allocated_capacity + -4 != (size_type *)(&paVar7->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                      (&paVar7->_M_allocated_capacity)[-4] + 1);
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  local_298 = local_60.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_60.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_3b0 = &local_200;
    __rhs_00 = local_60.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      libcellml::Parser::create(SUB81(local_2a8,0));
      std::operator+(&local_3d0,"analyser/units/",&__rhs_00->first);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_3d0);
      local_3f8 = &local_3e8;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar7) {
        local_3e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_3e8._8_8_ = plVar2[3];
      }
      else {
        local_3e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar2;
      }
      local_3f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
      *plVar2 = (long)paVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      fileContents((string *)&local_280);
      libcellml::Parser::parseModel(local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.first._M_dataplus._M_p != &local_280.first.field_2) {
        operator_delete(local_280.first._M_dataplus._M_p,
                        local_280.first.field_2._M_allocated_capacity + 1);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,local_3e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
      local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_3d0._M_dataplus._M_p = (pointer)libcellml::Logger::issueCount();
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_280,"size_t(0)","parser->issueCount()",
                 (unsigned_long *)&local_3f8,(unsigned_long *)&local_3d0);
      if ((char)local_280.first._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_3f8);
        pcVar6 = "";
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280.first._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pcVar6 = *(char **)(undefined1 *)local_280.first._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_3d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
                   ,0xab,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d0,(Message *)&local_3f8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
        if (local_3f8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          cVar1 = testing::internal::IsTrue(true);
          if ((cVar1 != '\0') &&
             (local_3f8 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(local_3f8->_M_allocated_capacity + 8))();
          }
          local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_280.first._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      __rhs = &__rhs_00->second;
      std::operator+(&local_80,"The units in \'bCst ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_3d0.field_2._M_allocated_capacity = *psVar3;
        local_3d0.field_2._8_8_ = plVar2[3];
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      }
      else {
        local_3d0.field_2._M_allocated_capacity = *psVar3;
        local_3d0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_3d0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3d0,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_3f8 = &local_3e8;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar7) {
        local_3e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_3e8._8_8_ = plVar2[3];
      }
      else {
        local_3e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar2;
      }
      local_3f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
      *plVar2 = (long)paVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_3f8);
      local_280.first._M_dataplus._M_p = (pointer)&local_280.first.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar7) {
        local_280.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_280.first.field_2._8_8_ = plVar2[3];
      }
      else {
        local_280.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_280.first._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_280.first._M_string_length = plVar2[1];
      *plVar2 = (long)paVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_a0,"The units in \'cCst ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
      local_2e8 = &local_2d8;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_2d8 = *plVar4;
        lStack_2d0 = plVar2[3];
      }
      else {
        local_2d8 = *plVar4;
        local_2e8 = (long *)*plVar2;
      }
      local_2e0 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2e8,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_2c8 = &local_2b8;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_2b8 = *plVar4;
        lStack_2b0 = plVar2[3];
      }
      else {
        local_2b8 = *plVar4;
        local_2c8 = (long *)*plVar2;
      }
      local_2c0 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      local_280.second._M_dataplus._M_p = (pointer)&local_280.second.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 == paVar7) {
        local_280.second.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_280.second.field_2._8_8_ = plVar2[3];
      }
      else {
        local_280.second.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_280.second._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_280.second._M_string_length = plVar2[1];
      *plVar2 = (long)paVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_c0,"The units in \'dCst ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
      local_328 = &local_318;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_318 = *plVar4;
        lStack_310 = plVar2[3];
      }
      else {
        local_318 = *plVar4;
        local_328 = (long *)*plVar2;
      }
      local_320 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_328,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_308 = &local_2f8;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_2f8 = *plVar4;
        lStack_2f0 = plVar2[3];
      }
      else {
        local_2f8 = *plVar4;
        local_308 = (long *)*plVar2;
      }
      local_300 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_308);
      local_240.first._M_dataplus._M_p = (pointer)&local_240.first.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_240.first.field_2._M_allocated_capacity = *psVar3;
        local_240.first.field_2._8_8_ = plVar2[3];
      }
      else {
        local_240.first.field_2._M_allocated_capacity = *psVar3;
        local_240.first._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_240.first._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_e0,"The units in \'eCst ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_e0);
      local_3a8 = &local_398;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_398 = *plVar4;
        lStack_390 = plVar2[3];
      }
      else {
        local_398 = *plVar4;
        local_3a8 = (long *)*plVar2;
      }
      local_3a0 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3a8,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_348 = &local_338;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_338 = *plVar4;
        lStack_330 = plVar2[3];
      }
      else {
        local_338 = *plVar4;
        local_348 = (long *)*plVar2;
      }
      local_340 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_348);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_240.second.field_2._M_allocated_capacity = *psVar3;
        local_240.second.field_2._8_8_ = plVar2[3];
        local_240.second._M_dataplus._M_p = (pointer)&local_240.second.field_2;
      }
      else {
        local_240.second.field_2._M_allocated_capacity = *psVar3;
        local_240.second._M_dataplus._M_p = (pointer)*plVar2;
      }
      paVar7 = &local_200.first.field_2;
      local_240.second._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_100,"The units in \'fCst ",__rhs);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_100);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_378 = *plVar4;
        lStack_370 = plVar2[3];
        local_388 = &local_378;
      }
      else {
        local_378 = *plVar4;
        local_388 = (long *)*plVar2;
      }
      local_380 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_388,(ulong)(__rhs_00->second)._M_dataplus._M_p);
      local_368 = &local_358;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_358 = *plVar4;
        lStack_350 = plVar2[3];
      }
      else {
        local_358 = *plVar4;
        local_368 = (long *)*plVar2;
      }
      local_360 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_368);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_200.first.field_2._M_allocated_capacity = *psVar3;
        local_200.first.field_2._8_8_ = plVar2[3];
        local_200.first._M_dataplus._M_p = (pointer)paVar7;
      }
      else {
        local_200.first.field_2._M_allocated_capacity = *psVar3;
        local_200.first._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_200.first._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      __l_00._M_len = 5;
      __l_00._M_array = &local_280.first;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,__l_00,&local_3d1);
      lVar5 = -0xa0;
      do {
        if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar7->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                          paVar7->_M_allocated_capacity + 1);
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar7->_M_allocated_capacity + -4);
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
      if (local_368 != &local_358) {
        operator_delete(local_368,local_358 + 1);
      }
      if (local_388 != &local_378) {
        operator_delete(local_388,local_378 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,local_2d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,local_3e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      libcellml::Analyser::create();
      libcellml::Analyser::analyseModel((shared_ptr *)local_280.first._M_dataplus._M_p);
      testing::ScopedTrace::ScopedTrace
                ((ScopedTrace *)&local_3d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
                 ,0xb9,"Issue occurred here.");
      local_3f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280.first._M_dataplus._M_p;
      local_3f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280.first._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280.first._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_280.first._M_string_length + 8) =
               *(int *)(local_280.first._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_280.first._M_string_length + 8) =
               *(int *)(local_280.first._M_string_length + 8) + 1;
        }
      }
      expectEqualIssues((vector *)&local_48,(shared_ptr *)&local_3f8);
      if (local_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0);
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_3d0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280.first._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280.first._M_string_length)
        ;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if (local_288 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288);
      }
      if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
      }
      __rhs_00 = __rhs_00 + 1;
    } while (__rhs_00 != local_298);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

TEST(AnalyserUnits, eq)
{
    std::vector<std::pair<std::string, std::string>> operators = {
        {"eq", "=="},
        {"neq", "!="},
        {"lt", "<"},
        {"leq", "<="},
        {"gt", ">"},
        {"geq", ">="},
    };

    for (const auto &op : operators) {
        auto parser = libcellml::Parser::create();
        auto model = parser->parseModel(fileContents("analyser/units/" + op.first + ".cellml"));

        EXPECT_EQ(size_t(0), parser->issueCount());

        const std::vector<std::string> expectedIssues = {
            "The units in 'bCst " + op.second + " 3.0' in equation 'b = bCst " + op.second + " 3.0' in component 'main' are not equivalent. 'bCst' is in 'second' while '3.0' is 'dimensionless'.",
            "The units in 'cCst " + op.second + " 5.0' in equation 'c = cCst " + op.second + " 5.0' in component 'main' are not equivalent. 'cCst' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3') while '5.0' is 'dimensionless'.",
            "The units in 'dCst " + op.second + " 7.0' in equation 'd = dCst " + op.second + " 7.0' in component 'main' are not equivalent. 'dCst' is in 'frog' while '7.0' is 'dimensionless'.",
            "The units in 'eCst " + op.second + " 9.0' in equation 'e = eCst " + op.second + " 9.0' in component 'main' are not equivalent. 'eCst' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16') while '9.0' is 'dimensionless'.",
            "The units in 'fCst " + op.second + " 11.0' in equation 'f = fCst " + op.second + " 11.0' in component 'main' are not equivalent. 'fCst' is in 'second' while '11.0' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
        };

        auto analyser = libcellml::Analyser::create();

        analyser->analyseModel(model);

        EXPECT_EQ_ISSUES(expectedIssues, analyser);
    }
}